

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_fe_mul(secp256k1_fe *a,secp256k1_fe *b,int use_sqr)

{
  uint64_t *puVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  uint64_t uVar92;
  uint64_t uVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  int iVar98;
  uint uVar99;
  int iVar100;
  ulong uVar101;
  long lVar102;
  ulong extraout_RAX;
  ulong uVar103;
  long lVar104;
  secp256k1_ge *extraout_RDX;
  ulong uVar105;
  secp256k1_gej *psVar106;
  secp256k1_fe *psVar107;
  ulong uVar108;
  secp256k1_ge *psVar109;
  secp256k1_gej *psVar110;
  secp256k1_fe *psVar111;
  secp256k1_fe *psVar112;
  secp256k1_fe *psVar113;
  secp256k1_ge *psVar114;
  secp256k1_ge *r;
  secp256k1_gej *b_00;
  secp256k1_gej *__src;
  secp256k1_gej *psVar115;
  secp256k1_fe *psVar116;
  ulong uVar117;
  ulong uVar118;
  ulong unaff_R12;
  secp256k1_ge *a_00;
  ulong unaff_R13;
  secp256k1_fe *unaff_R15;
  bool bVar119;
  undefined1 auVar120 [16];
  secp256k1_fe c;
  uint16_t c16 [16];
  uint16_t b16 [16];
  uint16_t a16 [16];
  uchar c32 [32];
  uchar b32 [32];
  uchar a32 [32];
  uint16_t t16 [32];
  secp256k1_fe bn;
  secp256k1_fe an;
  secp256k1_fe sStack_600;
  secp256k1_fe *psStack_5d0;
  secp256k1_fe sStack_5c0;
  secp256k1_fe sStack_590;
  secp256k1_fe sStack_560;
  secp256k1_fe sStack_528;
  secp256k1_fe sStack_4f8;
  secp256k1_fe sStack_4c8;
  secp256k1_gej *psStack_490;
  secp256k1_gej *psStack_488;
  secp256k1_fe *psStack_480;
  undefined1 *puStack_478;
  secp256k1_fe *psStack_470;
  secp256k1_fe *psStack_468;
  secp256k1_gej sStack_460;
  secp256k1_ge *psStack_3c0;
  secp256k1_ge *psStack_3b8;
  secp256k1_gej *psStack_3b0;
  secp256k1_ge *psStack_3a8;
  secp256k1_ge *psStack_3a0;
  secp256k1_ge *psStack_398;
  undefined1 auStack_390 [88];
  undefined8 uStack_338;
  secp256k1_fe *psStack_330;
  secp256k1_fe *psStack_320;
  secp256k1_gej *psStack_318;
  ulong uStack_310;
  ulong uStack_308;
  secp256k1_fe sStack_300;
  secp256k1_fe sStack_2d0;
  secp256k1_fe *psStack_2a0;
  ulong uStack_298;
  ulong uStack_290;
  secp256k1_fe *psStack_288;
  secp256k1_fe *psStack_280;
  secp256k1_fe *psStack_278;
  secp256k1_fe sStack_270;
  secp256k1_fe sStack_240;
  uint64_t uStack_210;
  uint64_t uStack_208;
  uint64_t uStack_200;
  uint64_t uStack_1f8;
  secp256k1_gej *psStack_1f0;
  secp256k1_fe *psStack_1e8;
  secp256k1_fe *psStack_1e0;
  secp256k1_fe *local_1d0;
  undefined1 local_1c8 [24];
  ulong uStack_1b0;
  ulong local_1a8;
  undefined8 uStack_1a0;
  ushort auStack_198 [16];
  uint16_t local_178 [16];
  uint16_t local_158 [16];
  ushort local_138 [16];
  ushort local_118 [16];
  ushort local_f8 [16];
  ulong local_d8 [8];
  undefined1 local_98 [32];
  uint64_t local_78;
  undefined8 uStack_70;
  uint64_t local_68;
  uint64_t uStack_60;
  uint64_t local_58;
  uint64_t uStack_50;
  uint64_t local_48;
  undefined8 uStack_40;
  
  local_1c8._0_8_ = a->n[0];
  local_1c8._8_8_ = a->n[1];
  unique0x00006c80 = *(undefined1 (*) [16])(a->n + 2);
  local_1a8 = a->n[4];
  uStack_1a0._0_4_ = a->magnitude;
  uStack_1a0._4_4_ = a->normalized;
  if (use_sqr == 0) {
    psStack_1e0 = (secp256k1_fe *)0x1584d0;
    secp256k1_fe_mul((secp256k1_fe *)local_1c8,(secp256k1_fe *)local_1c8,b);
LAB_001584d0:
    local_68 = a->n[0];
    uStack_60 = a->n[1];
    local_58 = a->n[2];
    uStack_50 = a->n[3];
    local_48 = a->n[4];
    uStack_40._0_4_ = a->magnitude;
    uStack_40._4_4_ = a->normalized;
    psVar106 = (secp256k1_gej *)&stack0xffffffffffffff98;
    local_98._0_8_ = b->n[0];
    local_98._8_8_ = b->n[1];
    local_98._16_16_ = *(undefined1 (*) [16])(b->n + 2);
    local_78 = b->n[4];
    uStack_70._0_4_ = b->magnitude;
    uStack_70._4_4_ = b->normalized;
    b = (secp256k1_fe *)local_98;
    unaff_R15 = (secp256k1_fe *)local_1c8;
    psStack_1e0 = (secp256k1_fe *)0x158520;
    secp256k1_fe_normalize_var(unaff_R15);
    psStack_1e0 = (secp256k1_fe *)0x158528;
    secp256k1_fe_normalize_var((secp256k1_fe *)psVar106);
    psStack_1e0 = (secp256k1_fe *)0x158530;
    secp256k1_fe_normalize_var(b);
    psStack_1e0 = (secp256k1_fe *)0x158540;
    secp256k1_fe_get_b32((uchar *)local_f8,(secp256k1_fe *)psVar106);
    psStack_1e0 = (secp256k1_fe *)0x158550;
    secp256k1_fe_get_b32((uchar *)local_118,b);
    psStack_1e0 = (secp256k1_fe *)0x158560;
    secp256k1_fe_get_b32((uchar *)local_138,unaff_R15);
    lVar102 = 0x10;
    lVar104 = 0;
    do {
      uVar4 = local_118[lVar102 + -1];
      *(ushort *)((long)local_158 + lVar104) =
           local_f8[lVar102 + -1] << 8 | local_f8[lVar102 + -1] >> 8;
      uVar5 = local_138[lVar102 + -1];
      *(ushort *)((long)local_178 + lVar104) = uVar4 << 8 | uVar4 >> 8;
      *(ushort *)((long)auStack_198 + lVar104) = uVar5 << 8 | uVar5 >> 8;
      lVar104 = lVar104 + 2;
      lVar102 = lVar102 + -1;
    } while (lVar102 != 0);
    psStack_1e0 = (secp256k1_fe *)0x1585c7;
    mulmod256((uint16_t *)local_d8,local_158,local_178,test_fe_mul::m16);
    lVar102 = 0;
    uVar105 = extraout_RAX;
    do {
      uVar101 = uVar105 & 0xffffffff;
      bVar2 = *(byte *)((long)local_d8 + lVar102);
      psVar107 = (secp256k1_fe *)(ulong)bVar2;
      bVar3 = *(byte *)((long)auStack_198 + lVar102);
      psVar110 = (secp256k1_gej *)(ulong)bVar3;
      uVar105 = (ulong)((uint)bVar2 - (uint)bVar3);
      if (bVar2 == bVar3) {
        uVar105 = uVar101;
      }
      iVar100 = (int)uVar105;
      if (bVar2 != bVar3) goto LAB_001585ef;
      lVar102 = lVar102 + 1;
    } while (lVar102 != 0x20);
    iVar100 = 0;
LAB_001585ef:
    if (iVar100 == 0) {
      return;
    }
    psStack_1e0 = (secp256k1_fe *)0x15860a;
    test_fe_mul_cold_2();
  }
  else {
    psVar106 = (secp256k1_gej *)local_1c8;
    psStack_1e0 = (secp256k1_fe *)0x15825a;
    psVar107 = b;
    psVar110 = psVar106;
    secp256k1_fe_verify((secp256k1_fe *)psVar106);
    if ((int)uStack_1a0 < 9) {
      unaff_R12 = local_1c8._16_8_;
      unaff_R13 = uStack_1b0;
      auVar120._8_8_ = 0;
      auVar120._0_8_ = local_1c8._0_8_ * 2;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uStack_1b0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_1c8._8_8_ * 2;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_1c8._16_8_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_1a8;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_1a8;
      uVar101 = SUB168(auVar8 * auVar48,0);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar101 & 0xfffffffffffff;
      auVar120 = auVar7 * auVar47 + auVar120 * auVar46 + auVar9 * ZEXT816(0x1000003d10);
      uVar105 = auVar120._0_8_;
      local_d8[0] = uVar105 & 0xfffffffffffff;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = uVar105 >> 0x34 | auVar120._8_8_ << 0xc;
      uVar105 = local_1a8 * 2;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_1c8._0_8_;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar105;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_1c8._8_8_ * 2;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uStack_1b0;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_1c8._16_8_;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = local_1c8._16_8_;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar101 >> 0x34 | SUB168(auVar8 * auVar48,8) << 0xc;
      auVar120 = auVar10 * auVar49 + auVar78 + auVar11 * auVar50 + auVar12 * auVar51 +
                 auVar13 * ZEXT816(0x1000003d10);
      uVar101 = auVar120._0_8_;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = uVar101 >> 0x34 | auVar120._8_8_ << 0xc;
      local_98._0_8_ = (uVar101 & 0xfffffffffffff) >> 0x30;
      local_68 = uVar101 & 0xffffffffffff;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_1c8._0_8_;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_1c8._0_8_;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_1c8._8_8_;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar105;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_1c8._16_8_ * 2;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uStack_1b0;
      auVar120 = auVar15 * auVar53 + auVar79 + auVar16 * auVar54;
      uVar101 = auVar120._0_8_;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = uVar101 >> 0x34 | auVar120._8_8_ << 0xc;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = (uVar101 & 0xfffffffffffff) << 4 | local_98._0_8_;
      auVar120 = auVar14 * auVar52 + ZEXT816(0x1000003d1) * auVar55;
      uVar117 = auVar120._0_8_;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = uVar117 >> 0x34 | auVar120._8_8_ << 0xc;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_1c8._0_8_ * 2;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = local_1c8._8_8_;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_1c8._16_8_;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar105;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uStack_1b0;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uStack_1b0;
      auVar7 = auVar18 * auVar57 + auVar81 + auVar19 * auVar58;
      uVar101 = auVar7._0_8_;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar101 & 0xfffffffffffff;
      auVar120 = auVar17 * auVar56 + auVar80 + auVar20 * ZEXT816(0x1000003d10);
      uVar118 = auVar120._0_8_;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = uVar101 >> 0x34 | auVar7._8_8_ << 0xc;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = uVar118 >> 0x34 | auVar120._8_8_ << 0xc;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_1c8._0_8_ * 2;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_1c8._16_8_;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_1c8._8_8_;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = local_1c8._8_8_;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uStack_1b0;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar105;
      auVar83 = auVar23 * auVar61 + auVar83;
      uVar105 = auVar83._0_8_;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar105 & 0xfffffffffffff;
      auVar120 = auVar21 * auVar59 + auVar82 + auVar22 * auVar60 + auVar24 * ZEXT816(0x1000003d10);
      uVar101 = auVar120._0_8_;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = (uVar101 >> 0x34 | auVar120._8_8_ << 0xc) + local_d8[0];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar105 >> 0x34 | auVar83._8_8_ << 0xc;
      auVar84 = auVar25 * ZEXT816(0x1000003d10) + auVar84;
      uVar105 = auVar84._0_8_;
      uStack_1b0 = uVar105 & 0xfffffffffffff;
      local_1c8._16_8_ = uVar101 & 0xfffffffffffff;
      local_1a8 = (uVar105 >> 0x34 | auVar84._8_8_ << 0xc) + local_68;
      uStack_1a0._0_4_ = 1;
      uStack_1a0._4_4_ = 0;
      psStack_1e0 = (secp256k1_fe *)0x1584be;
      local_1d0 = b;
      local_1c8._0_8_ = uVar117 & 0xfffffffffffff;
      local_1c8._8_8_ = uVar118 & 0xfffffffffffff;
      secp256k1_fe_verify((secp256k1_fe *)local_1c8);
      goto LAB_001584d0;
    }
  }
  psStack_1e0 = (secp256k1_fe *)test_sqrt;
  test_fe_mul_cold_1();
  psVar111 = &sStack_270;
  psVar112 = &sStack_270;
  psVar113 = &sStack_270;
  psVar116 = &sStack_270;
  psStack_278 = (secp256k1_fe *)0x158629;
  psStack_1f0 = psVar106;
  psStack_1e8 = b;
  psStack_1e0 = unaff_R15;
  uVar99 = secp256k1_fe_sqrt(&sStack_270,&psVar110->x);
  if (uVar99 == (psVar107 == (secp256k1_fe *)0x0)) {
    psStack_278 = (secp256k1_fe *)0x1587ed;
    test_sqrt_cold_7();
LAB_001587ed:
    psVar116 = b;
    psStack_278 = (secp256k1_fe *)0x1587f2;
    test_sqrt_cold_6();
LAB_001587f2:
    psStack_278 = (secp256k1_fe *)0x1587f7;
    test_sqrt_cold_5();
LAB_001587f7:
    psVar113 = psVar111;
    psStack_278 = (secp256k1_fe *)0x1587fc;
    test_sqrt_cold_4();
LAB_001587fc:
    psStack_278 = (secp256k1_fe *)0x158801;
    test_sqrt_cold_3();
LAB_00158801:
    psStack_278 = (secp256k1_fe *)0x158806;
    test_sqrt_cold_2();
  }
  else {
    if (psVar107 == (secp256k1_fe *)0x0) {
      return;
    }
    psStack_278 = (secp256k1_fe *)0x15864d;
    secp256k1_fe_verify(&sStack_270);
    psVar111 = psVar112;
    b = &sStack_270;
    if (1 < sStack_270.magnitude) goto LAB_001587ed;
    sStack_240.n[0] = 0x3ffffbfffff0bc - sStack_270.n[0];
    sStack_240.n[1] = 0x3ffffffffffffc - sStack_270.n[1];
    sStack_240.n[2] = 0x3ffffffffffffc - sStack_270.n[2];
    sStack_240.n[3] = 0x3ffffffffffffc - sStack_270.n[3];
    unaff_R15 = (secp256k1_fe *)(0x3fffffffffffc - sStack_270.n[4]);
    sStack_240.magnitude = 2;
    sStack_240.normalized = 0;
    psStack_278 = (secp256k1_fe *)0x1586af;
    sStack_240.n[4] = (uint64_t)unaff_R15;
    uStack_210 = sStack_240.n[2];
    uStack_208 = sStack_240.n[3];
    uStack_200 = sStack_240.n[0];
    uStack_1f8 = sStack_240.n[1];
    secp256k1_fe_verify(&sStack_240);
    psStack_278 = (secp256k1_fe *)0x1586b7;
    secp256k1_fe_verify(&sStack_270);
    psStack_278 = (secp256k1_fe *)0x1586bf;
    psVar111 = psVar107;
    secp256k1_fe_verify(psVar107);
    iVar100 = psVar107->magnitude + sStack_270.magnitude;
    if (0x20 < iVar100) goto LAB_001587f2;
    sStack_270.n[0] = psVar107->n[0] + sStack_270.n[0];
    sStack_270.n[1] = psVar107->n[1] + sStack_270.n[1];
    sStack_270.n[2] = psVar107->n[2] + sStack_270.n[2];
    sStack_270.n[3] = psVar107->n[3] + sStack_270.n[3];
    sStack_270.n[4] = sStack_270.n[4] + psVar107->n[4];
    sStack_270.normalized = 0;
    psStack_278 = (secp256k1_fe *)0x158704;
    sStack_270.magnitude = iVar100;
    secp256k1_fe_verify(&sStack_270);
    psStack_278 = (secp256k1_fe *)0x15870e;
    secp256k1_fe_verify(&sStack_240);
    psStack_278 = (secp256k1_fe *)0x158716;
    psVar111 = psVar107;
    secp256k1_fe_verify(psVar107);
    psVar116 = &sStack_270;
    if (0x1e < psVar107->magnitude) goto LAB_001587f7;
    sStack_240.n[0] = psVar107->n[0] + uStack_200;
    sStack_240.n[1] = psVar107->n[1] + uStack_1f8;
    psVar116 = &sStack_240;
    sStack_240.n[2] = psVar107->n[2] + uStack_210;
    sStack_240.n[3] = psVar107->n[3] + uStack_208;
    unaff_R15 = (secp256k1_fe *)((long)unaff_R15->n + psVar107->n[4]);
    sStack_240.normalized = 0;
    sStack_240.magnitude = psVar107->magnitude + 2;
    psStack_278 = (secp256k1_fe *)0x158766;
    sStack_240.n[4] = (uint64_t)unaff_R15;
    secp256k1_fe_verify(psVar116);
    psStack_278 = (secp256k1_fe *)0x158771;
    secp256k1_fe_normalize(&sStack_270);
    psStack_278 = (secp256k1_fe *)0x158779;
    secp256k1_fe_normalize(psVar116);
    psStack_278 = (secp256k1_fe *)0x158781;
    secp256k1_fe_verify(&sStack_270);
    psVar107 = &sStack_270;
    if (sStack_270.normalized == 0) goto LAB_001587fc;
    auVar94._8_8_ = sStack_270.n[1];
    auVar94._0_8_ = sStack_270.n[0];
    auVar95._8_8_ = sStack_270.n[3];
    auVar95._0_8_ = sStack_270.n[2];
    if ((SUB168(auVar94 | auVar95,8) == 0 && SUB168(auVar94 | auVar95,0) == 0) &&
        sStack_270.n[4] == 0) {
      return;
    }
    psVar107 = &sStack_240;
    psStack_278 = (secp256k1_fe *)0x1587b4;
    psVar113 = psVar107;
    secp256k1_fe_verify(psVar107);
    if (sStack_240.normalized == 0) goto LAB_00158801;
    auVar96._8_8_ = sStack_240.n[1];
    auVar96._0_8_ = sStack_240.n[0];
    auVar97._8_8_ = sStack_240.n[3];
    auVar97._0_8_ = sStack_240.n[2];
    if ((SUB168(auVar96 | auVar97,8) == 0 && SUB168(auVar96 | auVar97,0) == 0) &&
        (secp256k1_fe *)sStack_240.n[4] == (secp256k1_fe *)0x0) {
      return;
    }
  }
  psStack_278 = (secp256k1_fe *)random_group_element_jacobian_test;
  test_sqrt_cold_1();
  psVar109 = (secp256k1_ge *)(psVar113 + 2);
  psStack_330 = (secp256k1_fe *)0x15882e;
  psVar106 = psVar110;
  psStack_2a0 = psVar107;
  uStack_298 = unaff_R12;
  uStack_290 = unaff_R13;
  psStack_288 = psVar116;
  psStack_280 = unaff_R15;
  psStack_278 = a;
  random_fe_non_zero_test((secp256k1_fe *)psVar109);
  psStack_330 = (secp256k1_fe *)0x158836;
  psVar114 = psVar109;
  secp256k1_fe_verify((secp256k1_fe *)psVar109);
  if (psVar113[2].magnitude < 9) {
    psStack_320 = psVar113;
    psStack_318 = psVar110;
    uVar105 = (psVar109->x).n[0];
    uVar101 = psVar113[2].n[1];
    uVar117 = psVar113[2].n[2];
    uVar118 = psVar113[2].n[3];
    uVar6 = psVar113[2].n[4];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar105 * 2;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar118;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar101 * 2;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar117;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar6;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar6;
    uVar103 = SUB168(auVar28 * auVar64,0);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar103 & 0xfffffffffffff;
    auVar120 = auVar27 * auVar63 + auVar26 * auVar62 + auVar29 * ZEXT816(0x1000003d10);
    uVar108 = auVar120._0_8_;
    sStack_300.n[0] = uVar108 & 0xfffffffffffff;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar108 >> 0x34 | auVar120._8_8_ << 0xc;
    uVar6 = uVar6 * 2;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar105;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar6;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar101 * 2;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar118;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar117;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar117;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar103 >> 0x34 | SUB168(auVar28 * auVar64,8) << 0xc;
    auVar120 = auVar30 * auVar65 + auVar85 + auVar31 * auVar66 + auVar32 * auVar67 +
               auVar33 * ZEXT816(0x1000003d10);
    uStack_308 = auVar120._0_8_;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uStack_308 >> 0x34 | auVar120._8_8_ << 0xc;
    uStack_310 = (uStack_308 & 0xfffffffffffff) >> 0x30;
    uStack_308 = uStack_308 & 0xffffffffffff;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar105;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar105;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar101;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar6;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar117 * 2;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar118;
    auVar120 = auVar35 * auVar69 + auVar86 + auVar36 * auVar70;
    uVar103 = auVar120._0_8_;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar103 >> 0x34 | auVar120._8_8_ << 0xc;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = (uVar103 & 0xfffffffffffff) << 4 | uStack_310;
    auVar120 = auVar34 * auVar68 + ZEXT816(0x1000003d1) * auVar71;
    uVar103 = auVar120._0_8_;
    sStack_2d0.n[0] = uVar103 & 0xfffffffffffff;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar103 >> 0x34 | auVar120._8_8_ << 0xc;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar105 * 2;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar101;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar117;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar6;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar118;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar118;
    auVar7 = auVar38 * auVar73 + auVar88 + auVar39 * auVar74;
    uVar103 = auVar7._0_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar103 & 0xfffffffffffff;
    auVar120 = auVar37 * auVar72 + auVar87 + auVar40 * ZEXT816(0x1000003d10);
    uVar108 = auVar120._0_8_;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = uVar103 >> 0x34 | auVar7._8_8_ << 0xc;
    sStack_2d0.n[1] = uVar108 & 0xfffffffffffff;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = uVar108 >> 0x34 | auVar120._8_8_ << 0xc;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar105 * 2;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar117;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar101;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar101;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar118;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar6;
    auVar90 = auVar43 * auVar77 + auVar90;
    uVar105 = auVar90._0_8_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar105 & 0xfffffffffffff;
    auVar120 = auVar41 * auVar75 + auVar89 + auVar42 * auVar76 + auVar44 * ZEXT816(0x1000003d10);
    uVar101 = auVar120._0_8_;
    sStack_2d0.n[2] = uVar101 & 0xfffffffffffff;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = (uVar101 >> 0x34 | auVar120._8_8_ << 0xc) + sStack_300.n[0];
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar105 >> 0x34 | auVar90._8_8_ << 0xc;
    auVar91 = auVar45 * ZEXT816(0x1000003d10) + auVar91;
    uVar105 = auVar91._0_8_;
    sStack_2d0.n[3] = uVar105 & 0xfffffffffffff;
    sStack_2d0.n[4] = (uVar105 >> 0x34 | auVar91._8_8_ << 0xc) + uStack_308;
    sStack_2d0.magnitude = 1;
    sStack_2d0.normalized = 0;
    psStack_330 = (secp256k1_fe *)0x158a8a;
    secp256k1_fe_verify(&sStack_2d0);
    psStack_330 = (secp256k1_fe *)0x158a9d;
    secp256k1_fe_mul(&sStack_300,&sStack_2d0,(secp256k1_fe *)psVar109);
    psVar106 = psStack_318;
    psVar107 = psStack_320;
    psStack_330 = (secp256k1_fe *)0x158ab5;
    secp256k1_fe_mul(psStack_320,&psStack_318->x,&sStack_2d0);
    psStack_330 = (secp256k1_fe *)0x158ac5;
    secp256k1_fe_mul(psVar107 + 1,&psVar106->y,&sStack_300);
    *(int *)psVar107[3].n = (int)(psVar106->z).n[0];
    return;
  }
  psStack_330 = (secp256k1_fe *)random_fe_non_zero_test;
  random_group_element_jacobian_test_cold_1();
  psStack_330 = psVar113;
  while( true ) {
    uStack_338._0_4_ = 0x158af3;
    uStack_338._4_4_ = 0;
    random_fe_test(&psVar114->x);
    uStack_338._0_4_ = 0x158afb;
    uStack_338._4_4_ = 0;
    r = psVar114;
    secp256k1_fe_verify(&psVar114->x);
    if ((psVar114->x).normalized == 0) break;
    auVar120 = *(undefined1 (*) [16])((psVar114->x).n + 2) | *(undefined1 (*) [16])(psVar114->x).n;
    if ((auVar120._8_8_ != 0 || auVar120._0_8_ != 0) || (psVar114->x).n[4] != 0) {
      return;
    }
  }
  uStack_338 = secp256k1_ge_set_all_gej_var;
  random_fe_non_zero_test_cold_1();
  auStack_390._48_8_ = psVar114;
  auStack_390._56_8_ = unaff_R12;
  auStack_390._64_8_ = unaff_R13;
  auStack_390._72_8_ = psVar110;
  auStack_390._80_8_ = unaff_R15;
  uStack_338 = (code *)psVar109;
  if (extraout_RDX == (secp256k1_ge *)0x0) {
    psStack_398 = (secp256k1_ge *)0xffffffffffffffff;
  }
  else {
    psVar107 = &psVar106->z;
    psStack_398 = (secp256k1_ge *)0xffffffffffffffff;
    psVar109 = (secp256k1_ge *)0x0;
    psVar114 = r;
    do {
      psStack_3a0 = (secp256k1_ge *)0x158b64;
      secp256k1_gej_verify((secp256k1_gej *)(psVar107 + -2));
      if ((int)psVar107[1].n[0] == 0) {
        if (psStack_398 == (secp256k1_ge *)0xffffffffffffffff) {
          uVar92 = psVar107->n[0];
          uVar93 = psVar107->n[1];
          auVar120 = *(undefined1 (*) [16])(psVar107->n + 2);
          iVar100 = psVar107->magnitude;
          iVar98 = psVar107->normalized;
          (psVar114->x).n[4] = psVar107->n[4];
          (psVar114->x).magnitude = iVar100;
          (psVar114->x).normalized = iVar98;
          *(undefined1 (*) [16])((psVar114->x).n + 2) = auVar120;
          (psVar114->x).n[0] = uVar92;
          (psVar114->x).n[1] = uVar93;
          psStack_398 = psVar109;
        }
        else {
          psStack_3a0 = (secp256k1_ge *)0x158b92;
          secp256k1_fe_mul(&psVar114->x,&r[(long)psStack_398].x,psVar107);
          psStack_398 = psVar109;
        }
      }
      else {
        psStack_3a0 = (secp256k1_ge *)0x158b74;
        secp256k1_ge_set_infinity(psVar114);
      }
      psVar109 = (secp256k1_ge *)((long)(psVar109->x).n + 1);
      psVar114 = psVar114 + 1;
      psVar107 = (secp256k1_fe *)(psVar107[3].n + 1);
    } while (extraout_RDX != psVar109);
  }
  psVar114 = psStack_398;
  if (psStack_398 == (secp256k1_ge *)0xffffffffffffffff) {
    return;
  }
  a_00 = (secp256k1_ge *)((long)psStack_398 * 0x68);
  psVar110 = (secp256k1_gej *)(r + (long)psStack_398);
  b_00 = (secp256k1_gej *)auStack_390;
  psStack_3a0 = (secp256k1_ge *)0x158bf5;
  secp256k1_fe_inv_var((secp256k1_fe *)b_00,(secp256k1_fe *)psVar110);
  if (psVar114 != (secp256k1_ge *)0x0) {
    psVar109 = (secp256k1_ge *)&psVar114[-1].field_0x67;
    a_00 = r + -1 + (long)psVar114;
    psVar114 = (secp256k1_ge *)&psVar106[(long)&psVar114[-1].field_0x67].infinity;
    do {
      if ((int)(psVar114->x).n[0] == 0) {
        psStack_3a0 = (secp256k1_ge *)0x158c30;
        secp256k1_fe_mul(&r[(long)psStack_398].x,&a_00->x,(secp256k1_fe *)auStack_390);
        psVar110 = (secp256k1_gej *)auStack_390;
        psStack_3a0 = (secp256k1_ge *)0x158c4d;
        b_00 = psVar110;
        secp256k1_fe_mul((secp256k1_fe *)psVar110,(secp256k1_fe *)psVar110,
                         &psVar106[(long)psStack_398].z);
        psStack_398 = psVar109;
      }
      psVar114 = (secp256k1_ge *)(psVar114[-2].y.n + 1);
      a_00 = a_00 + -1;
      bVar119 = psVar109 != (secp256k1_ge *)0x0;
      psVar109 = (secp256k1_ge *)&psVar109[-1].field_0x67;
    } while (bVar119);
  }
  if (psVar106[(long)psStack_398].infinity == 0) {
    puVar1 = r[(long)psStack_398].x.n + 4;
    *puVar1 = auStack_390._32_8_;
    puVar1[1] = auStack_390._40_8_;
    puVar1 = r[(long)psStack_398].x.n + 2;
    *puVar1 = auStack_390._16_8_;
    puVar1[1] = auStack_390._24_8_;
    r[(long)psStack_398].x.n[0] = auStack_390._0_8_;
    r[(long)psStack_398].x.n[1] = auStack_390._8_8_;
    for (psVar109 = extraout_RDX; psVar109 != (secp256k1_ge *)0x0;
        psVar109 = (secp256k1_ge *)&psVar109[-1].field_0x67) {
      if (psVar106->infinity == 0) {
        psStack_3a0 = (secp256k1_ge *)0x158cb9;
        secp256k1_ge_set_gej_zinv(r,psVar106,&r->x);
      }
      psStack_3a0 = (secp256k1_ge *)0x158cc1;
      secp256k1_ge_verify(r);
      r = r + 1;
      psVar106 = psVar106 + 1;
    }
    return;
  }
  psStack_3a0 = (secp256k1_ge *)test_gej_cmov;
  secp256k1_ge_set_all_gej_var_cold_1();
  __src = &sStack_460;
  psVar115 = &sStack_460;
  psStack_468 = (secp256k1_fe *)0x158d0f;
  psStack_3c0 = a_00;
  psStack_3b8 = psVar114;
  psStack_3b0 = psVar106;
  psStack_3a8 = r;
  psStack_3a0 = psVar109;
  memcpy(&sStack_460,b_00,0x98);
  psStack_468 = (secp256k1_fe *)0x158d17;
  secp256k1_gej_verify(&sStack_460);
  psStack_468 = (secp256k1_fe *)0x158d1f;
  secp256k1_gej_verify(psVar110);
  psStack_468 = (secp256k1_fe *)0x158d2c;
  secp256k1_fe_cmov(&sStack_460.x,&psVar110->x,0);
  psVar107 = &psVar110->y;
  psStack_468 = (secp256k1_fe *)0x158d3f;
  secp256k1_fe_cmov(&sStack_460.y,psVar107,0);
  psVar111 = &sStack_460.z;
  psVar116 = &psVar110->z;
  psStack_468 = (secp256k1_fe *)0x158d55;
  secp256k1_fe_cmov(psVar111,psVar116,0);
  psStack_468 = (secp256k1_fe *)0x158d5d;
  secp256k1_gej_verify(&sStack_460);
  psStack_468 = (secp256k1_fe *)0x158d68;
  psVar106 = b_00;
  iVar100 = gej_xyz_equals_gej(&sStack_460,b_00);
  if (iVar100 == 0) {
    psStack_468 = (secp256k1_fe *)0x158dff;
    test_gej_cmov_cold_2();
  }
  else {
    psStack_468 = (secp256k1_fe *)0x158d7b;
    secp256k1_gej_verify(&sStack_460);
    psStack_468 = (secp256k1_fe *)0x158d83;
    secp256k1_gej_verify(psVar110);
    psStack_468 = (secp256k1_fe *)0x158d93;
    secp256k1_fe_cmov(&sStack_460.x,&psVar110->x,1);
    psStack_468 = (secp256k1_fe *)0x158da5;
    secp256k1_fe_cmov(&sStack_460.y,psVar107,1);
    psStack_468 = (secp256k1_fe *)0x158db5;
    secp256k1_fe_cmov(psVar111,psVar116,1);
    sStack_460.infinity = sStack_460.infinity & 0xfffffffeU | psVar110->infinity & 1U;
    psStack_468 = (secp256k1_fe *)0x158dd9;
    secp256k1_gej_verify(&sStack_460);
    psStack_468 = (secp256k1_fe *)0x158de4;
    psVar106 = psVar110;
    iVar100 = gej_xyz_equals_gej(&sStack_460,psVar110);
    __src = psVar115;
    if (iVar100 != 0) {
      return;
    }
  }
  psStack_468 = (secp256k1_fe *)gej_xyz_equals_gej;
  test_gej_cmov_cold_1();
  psStack_468 = psVar116;
  psStack_470 = psVar107;
  puStack_478 = (undefined1 *)&sStack_460;
  psStack_480 = psVar111;
  psStack_488 = b_00;
  psStack_490 = psVar110;
  if ((*(int *)((long)__src + 0x90) != psVar106->infinity) || (*(int *)((long)__src + 0x90) != 0)) {
    return;
  }
  psStack_5d0 = (secp256k1_fe *)0x158e51;
  memcpy(&sStack_528,__src,0x98);
  psVar107 = &sStack_5c0;
  psStack_5d0 = (secp256k1_fe *)0x158e66;
  memcpy(psVar107,psVar106,0x98);
  psStack_5d0 = (secp256k1_fe *)0x158e6e;
  secp256k1_fe_normalize(&sStack_528);
  psStack_5d0 = (secp256k1_fe *)0x158e7e;
  secp256k1_fe_normalize(&sStack_4f8);
  psStack_5d0 = (secp256k1_fe *)0x158e8e;
  secp256k1_fe_normalize(&sStack_4c8);
  psStack_5d0 = (secp256k1_fe *)0x158e96;
  secp256k1_fe_normalize(psVar107);
  psVar116 = &sStack_590;
  psStack_5d0 = (secp256k1_fe *)0x158ea3;
  secp256k1_fe_normalize(psVar116);
  psVar111 = &sStack_560;
  psStack_5d0 = (secp256k1_fe *)0x158eb0;
  secp256k1_fe_normalize(psVar111);
  psStack_5d0 = (secp256k1_fe *)0x158eb8;
  secp256k1_fe_verify(&sStack_528);
  psStack_5d0 = (secp256k1_fe *)0x158ec0;
  secp256k1_fe_verify(psVar107);
  if (sStack_528.normalized == 0) {
    psStack_5d0 = (secp256k1_fe *)0x158fc5;
    gej_xyz_equals_gej_cold_6();
LAB_00158fc5:
    psVar116 = psVar107;
    psStack_5d0 = (secp256k1_fe *)0x158fca;
    gej_xyz_equals_gej_cold_5();
LAB_00158fca:
    psStack_5d0 = (secp256k1_fe *)0x158fcf;
    gej_xyz_equals_gej_cold_4();
LAB_00158fcf:
    psVar111 = psVar116;
    psStack_5d0 = (secp256k1_fe *)0x158fd4;
    gej_xyz_equals_gej_cold_3();
  }
  else {
    if (sStack_5c0.normalized == 0) goto LAB_00158fc5;
    uVar99 = 4;
    do {
      uVar105 = sStack_5c0.n[uVar99];
      uVar101 = sStack_528.n[uVar99];
      if ((uVar101 >= uVar105 && uVar101 != uVar105) || (uVar101 < uVar105)) break;
      bVar119 = uVar99 != 0;
      uVar99 = uVar99 - 1;
    } while (bVar119);
    psStack_5d0 = (secp256k1_fe *)0x158f0a;
    secp256k1_fe_verify(&sStack_4f8);
    psStack_5d0 = (secp256k1_fe *)0x158f12;
    secp256k1_fe_verify(psVar116);
    if (sStack_4f8.normalized == 0) goto LAB_00158fca;
    if (sStack_590.normalized == 0) goto LAB_00158fcf;
    uVar99 = 4;
    do {
      uVar105 = sStack_590.n[uVar99];
      uVar101 = sStack_4f8.n[uVar99];
      if ((uVar101 >= uVar105 && uVar101 != uVar105) || (uVar101 < uVar105)) break;
      bVar119 = uVar99 != 0;
      uVar99 = uVar99 - 1;
    } while (bVar119);
    psStack_5d0 = (secp256k1_fe *)0x158f63;
    secp256k1_fe_verify(&sStack_4c8);
    psStack_5d0 = (secp256k1_fe *)0x158f6b;
    secp256k1_fe_verify(psVar111);
    if (sStack_4c8.normalized != 0) {
      if (sStack_560.normalized != 0) {
        uVar99 = 4;
        do {
          if (sStack_4c8.n[uVar99] != sStack_560.n[uVar99]) {
            return;
          }
          bVar119 = uVar99 != 0;
          uVar99 = uVar99 - 1;
        } while (bVar119);
        return;
      }
      goto LAB_00158fd9;
    }
  }
  psStack_5d0 = (secp256k1_fe *)0x158fd9;
  gej_xyz_equals_gej_cold_2();
LAB_00158fd9:
  psStack_5d0 = (secp256k1_fe *)secp256k1_gej_has_quad_y_var;
  gej_xyz_equals_gej_cold_1();
  if ((int)psVar111[3].n[0] == 0) {
    psStack_5d0 = &sStack_4c8;
    secp256k1_fe_mul(&sStack_600,psVar111 + 1,psVar111 + 2);
    secp256k1_fe_is_square_var(&sStack_600);
    return;
  }
  return;
}

Assistant:

static void test_fe_mul(const secp256k1_fe* a, const secp256k1_fe* b, int use_sqr)
{
    secp256k1_fe c, an, bn;
    /* Variables in BE 32-byte format. */
    unsigned char a32[32], b32[32], c32[32];
    /* Variables in LE 16x uint16_t format. */
    uint16_t a16[16], b16[16], c16[16];
    /* Field modulus in LE 16x uint16_t format. */
    static const uint16_t m16[16] = {
        0xfc2f, 0xffff, 0xfffe, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff,
        0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff,
    };
    uint16_t t16[32];
    int i;

    /* Compute C = A * B in fe format. */
    c = *a;
    if (use_sqr) {
        secp256k1_fe_sqr(&c, &c);
    } else {
        secp256k1_fe_mul(&c, &c, b);
    }

    /* Convert A, B, C into LE 16x uint16_t format. */
    an = *a;
    bn = *b;
    secp256k1_fe_normalize_var(&c);
    secp256k1_fe_normalize_var(&an);
    secp256k1_fe_normalize_var(&bn);
    secp256k1_fe_get_b32(a32, &an);
    secp256k1_fe_get_b32(b32, &bn);
    secp256k1_fe_get_b32(c32, &c);
    for (i = 0; i < 16; ++i) {
        a16[i] = a32[31 - 2*i] + ((uint16_t)a32[30 - 2*i] << 8);
        b16[i] = b32[31 - 2*i] + ((uint16_t)b32[30 - 2*i] << 8);
        c16[i] = c32[31 - 2*i] + ((uint16_t)c32[30 - 2*i] << 8);
    }
    /* Compute T = A * B in LE 16x uint16_t format. */
    mulmod256(t16, a16, b16, m16);
    /* Compare */
    CHECK(secp256k1_memcmp_var(t16, c16, 32) == 0);
}